

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cJSON_add_object_should_add_object(void)

{
  cJSON *object_00;
  cJSON *pcVar1;
  cJSON *object;
  cJSON *root;
  
  object_00 = cJSON_CreateObject();
  cJSON_AddObjectToObject(object_00,"object");
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object_00,"object");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x13d);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x40,(char *)0x0,0x13e,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object_00);
  return;
}

Assistant:

static void cJSON_add_object_should_add_object(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *object = NULL;

    cJSON_AddObjectToObject(root, "object");
    TEST_ASSERT_NOT_NULL(object = cJSON_GetObjectItemCaseSensitive(root, "object"));
    TEST_ASSERT_EQUAL_INT(object->type, cJSON_Object);

    cJSON_Delete(root);
}